

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t
decoder_set_fb_fn(aom_codec_alg_priv_t *ctx,aom_get_frame_buffer_cb_fn_t cb_get,
                 aom_release_frame_buffer_cb_fn_t cb_release,void *cb_priv)

{
  void *cb_priv_local;
  aom_release_frame_buffer_cb_fn_t cb_release_local;
  aom_get_frame_buffer_cb_fn_t cb_get_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  if ((cb_get == (aom_get_frame_buffer_cb_fn_t)0x0) ||
     (cb_release == (aom_release_frame_buffer_cb_fn_t)0x0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    ctx->get_ext_fb_cb = cb_get;
    ctx->release_ext_fb_cb = cb_release;
    ctx->ext_priv = cb_priv;
    local_4 = AOM_CODEC_OK;
  }
  else {
    local_4 = AOM_CODEC_ERROR;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t decoder_set_fb_fn(
    aom_codec_alg_priv_t *ctx, aom_get_frame_buffer_cb_fn_t cb_get,
    aom_release_frame_buffer_cb_fn_t cb_release, void *cb_priv) {
  if (cb_get == NULL || cb_release == NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (ctx->frame_worker != NULL) {
    // If the decoder has already been initialized, do not accept changes to
    // the frame buffer functions.
    return AOM_CODEC_ERROR;
  }

  ctx->get_ext_fb_cb = cb_get;
  ctx->release_ext_fb_cb = cb_release;
  ctx->ext_priv = cb_priv;
  return AOM_CODEC_OK;
}